

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loclikely.cpp
# Opt level: O2

UBool do_canonicalize(char *localeID,char *buffer,int32_t bufferCapacity,UErrorCode *err)

{
  UErrorCode UVar1;
  bool bVar2;
  undefined4 in_register_00000014;
  UErrorCode *err_00;
  
  err_00 = (UErrorCode *)CONCAT44(in_register_00000014,bufferCapacity);
  uloc_canonicalize_63(localeID,buffer,0x9d,err_00);
  UVar1 = *err_00;
  if ((UVar1 == U_BUFFER_OVERFLOW_ERROR) || (UVar1 == U_STRING_NOT_TERMINATED_WARNING)) {
    *err_00 = U_ILLEGAL_ARGUMENT_ERROR;
    bVar2 = false;
  }
  else {
    bVar2 = UVar1 < U_ILLEGAL_ARGUMENT_ERROR;
  }
  return bVar2;
}

Assistant:

static UBool
do_canonicalize(const char*    localeID,
         char* buffer,
         int32_t bufferCapacity,
         UErrorCode* err)
{
    uloc_canonicalize(
        localeID,
        buffer,
        bufferCapacity,
        err);

    if (*err == U_STRING_NOT_TERMINATED_WARNING ||
        *err == U_BUFFER_OVERFLOW_ERROR) {
        *err = U_ILLEGAL_ARGUMENT_ERROR;

        return FALSE;
    }
    else if (U_FAILURE(*err)) {

        return FALSE;
    }
    else {
        return TRUE;
    }
}